

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall echo_server::connection::try_write(connection *this)

{
  size_t sVar1;
  timer *t;
  size_t written;
  connection *this_local;
  
  if (this->end_offset <= this->start_offset) {
    __assert_fail("start_offset < end_offset",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp"
                  ,0x1f,"void echo_server::connection::try_write()");
  }
  if (this->end_offset == 0) {
    __assert_fail("end_offset != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp"
                  ,0x20,"void echo_server::connection::try_write()");
  }
  sVar1 = client_socket::write_some
                    (&this->socket,this->buf + this->start_offset,
                     this->end_offset - this->start_offset);
  if (sVar1 != 0) {
    t = sysapi::epoll::get_timer(this->parent->ep);
    timer_element::restart(&this->timer,t,(duration)0x37e11d600);
    this->start_offset = sVar1 + this->start_offset;
    if (this->start_offset == this->end_offset) {
      this->start_offset = 0;
      this->end_offset = 0;
    }
  }
  return;
}

Assistant:

void echo_server::connection::try_write()
{
    assert(start_offset < end_offset);
    assert(end_offset != 0);

    size_t written = socket.write_some(buf + start_offset, end_offset - start_offset);
    if (written == 0)
        return;

    timer.restart(parent->ep.get_timer(), timeout);
    start_offset += written;
    if (start_offset == end_offset)
    {
        start_offset = 0;
        end_offset = 0;
    }
}